

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

void crnlib::dxt_fast::compress_color_block
               (dxt1_block *pDXT1_block,color_quad_u8 *pBlock,bool refine)

{
  int local_48;
  uint local_44;
  int i;
  uint mask;
  uint high16;
  uint low16;
  uint8 color_selectors [16];
  bool refine_local;
  color_quad_u8 *pBlock_local;
  dxt1_block *pDXT1_block_local;
  
  compress_color_block(0x10,pBlock,&mask,(uint *)&i,(uint8 *)&high16,refine);
  dxt1_block::set_low_color(pDXT1_block,(uint16)mask);
  dxt1_block::set_high_color(pDXT1_block,(uint16)i);
  local_44 = 0;
  for (local_48 = 0xf; -1 < local_48; local_48 = local_48 + -1) {
    local_44 = (uint)*(byte *)((long)&high16 + (long)local_48) | local_44 << 2;
  }
  pDXT1_block->m_selectors[0] = (uint8)local_44;
  pDXT1_block->m_selectors[1] = (uint8)(local_44 >> 8);
  pDXT1_block->m_selectors[2] = (uint8)(local_44 >> 0x10);
  pDXT1_block->m_selectors[3] = (uint8)(local_44 >> 0x18);
  return;
}

Assistant:

void compress_color_block(dxt1_block* pDXT1_block, const color_quad_u8* pBlock, bool refine)
        {
            uint8 color_selectors[16];
            uint low16, high16;
            dxt_fast::compress_color_block(16, pBlock, low16, high16, color_selectors, refine);

            pDXT1_block->set_low_color(static_cast<uint16>(low16));
            pDXT1_block->set_high_color(static_cast<uint16>(high16));

            uint mask = 0;
            for (int i = 15; i >= 0; i--)
            {
                mask <<= 2;
                mask |= color_selectors[i];
            }

            pDXT1_block->m_selectors[0] = (uint8)(mask & 0xFF);
            pDXT1_block->m_selectors[1] = (uint8)((mask >> 8) & 0xFF);
            pDXT1_block->m_selectors[2] = (uint8)((mask >> 16) & 0xFF);
            pDXT1_block->m_selectors[3] = (uint8)((mask >> 24) & 0xFF);
        }